

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O3

void Res_WinAddMissing(Res_Win_t *p)

{
  ulong uVar1;
  int iVar2;
  undefined4 uVar3;
  Abc_Ntk_t *pAVar4;
  long lVar5;
  int *__s;
  Vec_Ptr_t *pVVar6;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long lVar7;
  int iVar8;
  
  pAVar4 = p->pNode->pNtk;
  if ((pAVar4->vTravIds).pArray == (int *)0x0) {
    iVar2 = pAVar4->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar8 = (int)uVar1;
    if ((pAVar4->vTravIds).nCap < iVar8) {
      __s = (int *)malloc(uVar1 * 4);
      (pAVar4->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar4->vTravIds).nCap = iVar8;
      in_RDX = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar2) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pAVar4->vTravIds).nSize = iVar8;
  }
  iVar2 = pAVar4->nTravIds;
  pAVar4->nTravIds = iVar2 + 1;
  if (0x3ffffffe < iVar2) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar6 = p->vLeaves;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      lVar5 = *pVVar6->pArray[lVar7];
      iVar2 = (int)*(long *)((long)pVVar6->pArray[lVar7] + 0x10);
      uVar3 = *(undefined4 *)(lVar5 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar2 + 1,(int)in_RDX);
      if (((long)iVar2 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar2)) goto LAB_0046f236;
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar2 * 4) = uVar3;
      lVar7 = lVar7 + 1;
      pVVar6 = p->vLeaves;
      in_RDX = extraout_RDX_01;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = p->vNodes;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      lVar5 = *pVVar6->pArray[lVar7];
      iVar2 = (int)*(long *)((long)pVVar6->pArray[lVar7] + 0x10);
      uVar3 = *(undefined4 *)(lVar5 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar2 + 1,(int)in_RDX);
      if (((long)iVar2 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar2)) {
LAB_0046f236:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar2 * 4) = uVar3;
      lVar7 = lVar7 + 1;
      pVVar6 = p->vNodes;
      in_RDX = extraout_RDX_02;
    } while (lVar7 < pVVar6->nSize);
  }
  p->vBranches->nSize = 0;
  pVVar6 = p->vRoots;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      Res_WinAddMissing_rec(p,(Abc_Obj_t *)pVVar6->pArray[lVar7],p->nLevTravMin);
      lVar7 = lVar7 + 1;
      pVVar6 = p->vRoots;
    } while (lVar7 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Res_WinAddMissing( Res_Win_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // mark the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // mark the already collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // explore from the roots
    Vec_PtrClear( p->vBranches );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Res_WinAddMissing_rec( p, pObj, p->nLevTravMin );
}